

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<(ChArchiveOut *this,ChNameValue<chrono::ChVector<double>_> *bVal)

{
  ChNameValue<chrono::ChVector<double>_> local_28;
  
  local_28._name = bVal->_name;
  local_28._value = bVal->_value;
  local_28._flags = bVal->_flags;
  out<chrono::ChVector<double>>(this,&local_28);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }